

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O3

int canvas_undo_objectstate(_glist *cnv,void *z,int action)

{
  t_symbol *s;
  int iVar1;
  t_atom *argv;
  t_gobj *x;
  _binbuf *x_00;
  
  iVar1 = *z;
  x = cnv->gl_list;
  if (iVar1 != 0 && x != (t_gobj *)0x0) {
    do {
      iVar1 = iVar1 + -1;
      x = x->g_next;
      if (x == (t_gobj *)0x0) break;
    } while (iVar1 != 0);
  }
  if (action == 2) {
    x_00 = *(_binbuf **)((long)z + 0x18);
  }
  else {
    x_00 = *(_binbuf **)((long)z + 0x10);
    if (action != 1) {
      if (action != 0) {
        return 1;
      }
      binbuf_free(x_00);
      binbuf_free(*(_binbuf **)((long)z + 0x18));
      freebytes(z,0x20);
      return 1;
    }
  }
  if (x != (t_gobj *)0x0) {
    s = *(t_symbol **)((long)z + 8);
    iVar1 = binbuf_getnatom(x_00);
    argv = binbuf_getvec(x_00);
    pd_typedmess(&x->g_pd,s,iVar1,argv);
  }
  return 1;
}

Assistant:

int canvas_undo_objectstate(t_canvas *cnv, void *z, int action) {
    t_undo_object_state *buf = z;
    t_binbuf*bbuf = buf->u_undo;
    t_pd*x = (t_pd*)glist_nth(cnv, buf->u_obj);
    switch(action) {
    case UNDO_FREE:
        binbuf_free(buf->u_undo);
        binbuf_free(buf->u_redo);
        t_freebytes(buf, sizeof(*buf));
        break;
    case UNDO_REDO:
        bbuf = buf->u_redo;     /* falls through */
    case UNDO_UNDO:
        if(x)
            pd_typedmess(x, buf->u_symbol, binbuf_getnatom(bbuf), binbuf_getvec(bbuf));
        break;
    }
    return 1;
}